

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

sunrealtype * N_VGetSubvectorArrayPointer_ManyVector(N_Vector v,sunindextype vec_num)

{
  long in_RSI;
  long *in_RDI;
  sunrealtype *arr;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_20;
  
  local_20 = (sunrealtype *)0x0;
  if (*(long *)(*(long *)(*(long *)(*(long *)(*in_RDI + 0x10) + in_RSI * 8) + 8) + 0x28) != 0) {
    local_20 = (sunrealtype *)
               N_VGetArrayPointer(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + in_RSI * 8));
  }
  return local_20;
}

Assistant:

sunrealtype* MVAPPEND(N_VGetSubvectorArrayPointer)(N_Vector v,
                                                   sunindextype vec_num)
{
  SUNFunctionBegin(v->sunctx);
  SUNAssertNull(vec_num >= 0, SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(vec_num < MANYVECTOR_NUM_SUBVECS(v), SUN_ERR_ARG_OUTOFRANGE);
  sunrealtype* arr = NULL;
  if (MANYVECTOR_SUBVEC(v, vec_num)->ops->nvgetarraypointer)
  {
    arr = N_VGetArrayPointer(MANYVECTOR_SUBVEC(v, vec_num));
    SUNCheckLastErrNull();
  }
  return arr;
}